

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.hpp
# Opt level: O0

void chaiscript::bootstrap::array<int[5],void>(string *type,Module *m)

{
  Type_Info ti;
  Module *pMVar1;
  allocator<char> local_119;
  string local_118;
  anon_class_1_0_00000001_for_m_f local_f1;
  Proxy_Function local_f0;
  allocator<char> local_d9;
  string local_d8;
  anon_class_1_0_00000001_for_m_f local_b1;
  Proxy_Function local_b0;
  allocator<char> local_99;
  string local_98;
  anon_class_1_0_00000001_for_m_f local_71;
  Proxy_Function local_70 [2];
  string local_50;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  Module *local_18;
  Module *m_local;
  string *type_local;
  
  local_18 = m;
  m_local = (Module *)type;
  user_type<int[5]>();
  std::__cxx11::string::string
            ((string *)&local_50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)m_local);
  ti.m_bare_type_info = (type_info *)uStack_28;
  ti.m_type_info = (type_info *)local_30;
  ti._16_8_ = local_20;
  Module::add(m,ti,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  pMVar1 = local_18;
  fun<chaiscript::bootstrap::array<int[5],void>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(int(&)[5],unsigned_long)_1_>
            ((chaiscript *)local_70,&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"[]",&local_99);
  Module::add(pMVar1,local_70,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(local_70);
  pMVar1 = local_18;
  fun<chaiscript::bootstrap::array<int[5],void>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(int_const(&)[5],unsigned_long)_1_>
            ((chaiscript *)&local_b0,&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"[]",&local_d9);
  Module::add(pMVar1,&local_b0,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_b0);
  pMVar1 = local_18;
  fun<chaiscript::bootstrap::array<int[5],void>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(int_const(&)[5])_1_>
            ((chaiscript *)&local_f0,&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"size",&local_119);
  Module::add(pMVar1,&local_f0,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator(&local_119);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_f0);
  return;
}

Assistant:

void array(const std::string &type, Module &m) {
    using ReturnType = typename std::remove_extent<T>::type;

    m.add(user_type<T>(), type);
    m.add(fun([](T &t, size_t index) -> ReturnType & {
            constexpr const auto extent = std::extent<T>::value;
            if (extent > 0 && index >= extent) {
              throw std::range_error("Array index out of range. Received: " + std::to_string(index) + " expected < "
                                     + std::to_string(extent));
            } else {
              return t[index];
            }
          }),
          "[]");

    m.add(fun([](const T &t, size_t index) -> const ReturnType & {
            constexpr const auto extent = std::extent<T>::value;
            if (extent > 0 && index >= extent) {
              throw std::range_error("Array index out of range. Received: " + std::to_string(index) + " expected < "
                                     + std::to_string(extent));
            } else {
              return t[index];
            }
          }),
          "[]");

    m.add(fun([](const T &) { return std::extent<T>::value; }), "size");
  }